

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

void ckh_pointer_hash(void *key,size_t *r_hash)

{
  ulong uVar1;
  ulong uVar2;
  anon_union_8_2_9473010e u;
  ulong uVar3;
  size_t sVar4;
  
  uVar2 = ((ulong)((long)key * -0x783c846eeebdac2b) >> 0x21 | (long)key * -0x775ed61580000000) *
          0x4cf5ad432745937f ^ 0xd9833966;
  uVar1 = uVar2 + 0xd9833966;
  uVar2 = uVar2 + 0x1b30672cc;
  uVar1 = (uVar1 >> 0x21 ^ uVar1) * -0xae502812aa7333;
  uVar3 = (uVar1 >> 0x21 ^ uVar1) * -0x3b314601e57a13ad;
  uVar1 = (uVar2 >> 0x21 ^ uVar2) * -0xae502812aa7333;
  uVar1 = (uVar1 >> 0x21 ^ uVar1) * -0x3b314601e57a13ad;
  uVar1 = uVar1 >> 0x21 ^ uVar1;
  sVar4 = (uVar3 >> 0x21 ^ uVar3) + uVar1;
  *r_hash = sVar4;
  r_hash[1] = uVar1 + sVar4;
  return;
}

Assistant:

void
ckh_pointer_hash(const void *key, size_t r_hash[2]) {
	union {
		const void	*v;
		size_t		i;
	} u;

	assert(sizeof(u.v) == sizeof(u.i));
	u.v = key;
	hash(&u.i, sizeof(u.i), 0xd983396eU, r_hash);
}